

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  uchar *puVar1;
  byte bVar2;
  connectdata *conn;
  connectdata *pcVar3;
  char *pcVar4;
  sockaddr *psVar5;
  curl_trc_feat *pcVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  _Bool _Var10;
  ushort uVar11;
  CURLcode CVar12;
  uint uVar13;
  int iVar14;
  CURLproxycode CVar15;
  socks_state *sx;
  long lVar16;
  size_t sVar17;
  uchar uVar18;
  int code;
  ulong uVar19;
  Curl_addrinfo *pCVar20;
  ssize_t sVar21;
  char *pcVar22;
  ulong uVar23;
  connect_t cVar24;
  Curl_dns_entry *dns;
  char *local_a0;
  size_t local_98;
  char *local_90;
  uchar ip4 [4];
  char dest [46];
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar12 = CURLE_OK;
    _Var10 = true;
    goto LAB_0015852c;
  }
  sx = (socks_state *)cf->ctx;
  conn = cf->conn;
  iVar14 = cf->sockindex;
  CVar12 = (*(code *)cf->next->cft->do_connect)(cf->next,data,done);
  if (CVar12 != CURLE_OK) {
    return CVar12;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  cVar24 = sx->state;
  if (cVar24 == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar16 = 0x138;
    if (((((ulong)conn->bits & 1) == 0) && (lVar16 = 0xe0, (SUB84(conn->bits,0) >> 8 & 1) == 0)) &&
       (lVar16 = 0xb0, iVar14 == 1)) {
      sx->hostname = conn->secondaryhostname;
      if (((ulong)conn->bits & 1) == 0) {
LAB_00158562:
        uVar13 = (uint)conn->secondary_port;
      }
      else {
LAB_0015856b:
        uVar13 = (conn->http_proxy).port;
      }
    }
    else {
      sx->hostname = *(char **)((long)&(conn->cpool_node)._list + lVar16);
      if (((ulong)conn->bits & 1) != 0) goto LAB_0015856b;
      if (iVar14 == 1) goto LAB_00158562;
      if ((SUB84(conn->bits,0) >> 9 & 1) == 0) {
        uVar13 = conn->remote_port;
      }
      else {
        uVar13 = conn->conn_to_port;
      }
    }
    sx->remote_port = uVar13;
    uVar7 = *(undefined4 *)((long)&(conn->socks_proxy).user + 4);
    uVar8 = *(undefined4 *)&(conn->socks_proxy).passwd;
    uVar9 = *(undefined4 *)((long)&(conn->socks_proxy).passwd + 4);
    *(undefined4 *)&sx->proxy_user = *(undefined4 *)&(conn->socks_proxy).user;
    *(undefined4 *)((long)&sx->proxy_user + 4) = uVar7;
    *(undefined4 *)&sx->proxy_password = uVar8;
    *(undefined4 *)((long)&sx->proxy_password + 4) = uVar9;
    cVar24 = CONNECT_SOCKS_INIT;
  }
  pcVar3 = cf->conn;
  bVar2 = (pcVar3->socks_proxy).proxytype;
  switch(bVar2) {
  case 4:
  case 6:
    break;
  case 5:
  case 7:
    pcVar22 = sx->hostname;
    local_a0 = (char *)(ulong)bVar2;
    sVar17 = strlen(pcVar22);
    bVar2 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    if (0xf < cVar24 - CONNECT_SOCKS_INIT) {
switchD_001586ca_caseD_5:
      if (((data->set).field_0x89f & 0x40) == 0) {
        CVar15 = CURLPX_OK;
      }
      else {
        pcVar6 = (data->state).feat;
        if ((pcVar6 == (curl_trc_feat *)0x0) || (CVar15 = CURLPX_OK, 0 < pcVar6->log_level)) {
          Curl_infof(data,"SOCKS5 request granted.");
          CVar15 = CURLPX_OK;
        }
      }
      goto LAB_00159945;
    }
    puVar1 = sx->buffer;
    switch(cVar24) {
    case CONNECT_SOCKS_INIT:
      if (((((ulong)pcVar3->bits & 1) != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar22);
      }
      if (((char)local_a0 == '\x05') || (sVar17 < 0x100)) {
        local_98 = sVar17;
        if ((((bVar2 & 0xfa) != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                     (ulong)bVar2);
        }
        if ((bVar2 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
          sx->buffer[0] = '\x05';
          sVar21 = 3;
          lVar16 = 0x12;
          uVar18 = '\0';
LAB_00158e09:
          sx->buffer[lVar16 + -0x10] = uVar18;
        }
        else {
          pcVar22 = sx->proxy_user;
          sx->buffer[0] = '\x05';
          sx->buffer[2] = '\0';
          if (pcVar22 != (char *)0x0) {
            sVar21 = 4;
            uVar18 = '\x02';
            lVar16 = 0x13;
            goto LAB_00158e09;
          }
          sVar21 = 3;
        }
        sx->buffer[1] = (char)sVar21 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar21;
        CVar15 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar15 == CURLPX_OK) {
          if (sx->outstanding == 0) {
            sVar17 = local_98;
            if (sx->state != CONNECT_SOCKS_READ) {
              sx->state = CONNECT_SOCKS_READ;
            }
            goto switchD_001586ca_caseD_3;
          }
          CVar15 = CURLPX_OK;
        }
      }
      else {
        Curl_failf(data,
                   "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                  );
        CVar15 = CURLPX_LONG_HOSTNAME;
      }
      goto LAB_00159945;
    case CONNECT_SOCKS_SEND:
      CVar15 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (CVar15 != CURLPX_OK) goto LAB_00159945;
      if (sx->outstanding == 0) goto switchD_001586ca_caseD_3;
      goto LAB_0015993e;
    case CONNECT_SOCKS_READ_INIT:
switchD_001586ca_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
      break;
    case CONNECT_GSSAPI_INIT:
      goto switchD_001586ca_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_001586ca_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_001586ca_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_001586ca_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_001586ca_caseD_9;
    case CONNECT_RESOLVING:
      CVar12 = Curl_resolv_check(data,&dns);
      if (dns == (Curl_dns_entry *)0x0) {
        CVar15 = CURLPX_RESOLVE_HOST;
        if (CVar12 == CURLE_OK) {
          CVar15 = CURLPX_OK;
        }
        goto LAB_00159945;
      }
      goto LAB_00158990;
    case CONNECT_RESOLVED:
      goto switchD_001586ca_caseD_b;
    case CONNECT_RESOLVE_REMOTE:
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      lVar16 = 3;
      if ((char)local_a0 == '\x05') goto LAB_001596cb;
      goto LAB_0015935b;
    case CONNECT_REQ_SEND:
      lVar16 = 0;
      goto LAB_001596cb;
    case CONNECT_REQ_SENDING:
      goto switchD_001586ca_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_001586ca_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_001586ca_caseD_10;
    }
    CVar15 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
    if (CVar15 != CURLPX_OK) goto LAB_00159945;
    if (sx->outstanding != 0) {
LAB_001592ee:
      CVar15 = CURLPX_OK;
      goto LAB_00159945;
    }
    if (*puVar1 != '\x05') {
      Curl_failf(data,"Received invalid version in initial SOCKS5 response.");
      goto LAB_00158c1b;
    }
    bVar2 = sx->buffer[1];
    if (1 < bVar2) {
      if (bVar2 == 2) {
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_001586ca_caseD_6:
        pcVar22 = sx->proxy_user;
        if ((pcVar22 == (char *)0x0) || (pcVar4 = sx->proxy_password, pcVar4 == (char *)0x0)) {
          sx->buffer[0] = '\x01';
          sx->buffer[1] = '\0';
          sx->buffer[2] = '\0';
          lVar16 = 3;
          pcVar22 = (char *)0x0;
        }
        else {
          local_98 = sVar17;
          local_90 = pcVar22;
          sVar17 = strlen(pcVar22);
          pcVar22 = (char *)strlen(pcVar4);
          pcVar4 = local_90;
          sx->buffer[0] = '\x01';
          sx->buffer[1] = (uchar)sVar17;
          if (sVar17 != 0) {
            if (0xff < sVar17) {
              Curl_failf(data,"Excessive username length for proxy auth");
              CVar15 = CURLPX_LONG_USER;
              goto LAB_00159945;
            }
            local_90 = pcVar22;
            memcpy(sx->buffer + 2,pcVar4,sVar17);
            pcVar22 = local_90;
          }
          lVar16 = sVar17 + 3;
          sx->buffer[sVar17 + 2] = (uchar)pcVar22;
          sVar17 = local_98;
          if (pcVar22 != (char *)0x0 && sx->proxy_password != (char *)0x0) {
            if ((char *)0xff < pcVar22) {
              Curl_failf(data,"Excessive password length for proxy auth");
              CVar15 = CURLPX_LONG_PASSWD;
              goto LAB_00159945;
            }
            memcpy(puVar1 + lVar16,sx->proxy_password,(size_t)pcVar22);
            sVar17 = local_98;
          }
        }
        if (sx->state != CONNECT_AUTH_SEND) {
          sx->state = CONNECT_AUTH_SEND;
        }
        sx->outstanding = (ssize_t)(pcVar22 + lVar16);
        sx->outp = puVar1;
switchD_001586ca_caseD_7:
        CVar15 = socks_state_send(cf->next,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request"
                                 );
        if (CVar15 == CURLPX_OK) {
          if (sx->outstanding == 0) {
            sx->outp = puVar1;
            sx->outstanding = 2;
            if (sx->state != CONNECT_AUTH_READ) {
              sx->state = CONNECT_AUTH_READ;
            }
switchD_001586ca_caseD_8:
            CVar15 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_AUTH,
                                      "SOCKS5 sub-negotiation response");
            if (CVar15 == CURLPX_OK) {
              if (sx->outstanding != 0) goto LAB_001592ee;
              if (sx->buffer[1] == '\0') {
                cVar24 = sx->state;
                goto LAB_0015933c;
              }
              Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
              CVar15 = CURLPX_USER_REJECTED;
            }
          }
          else {
            CVar15 = CURLPX_OK;
          }
        }
      }
      else {
        if (bVar2 != 0xff) goto LAB_001590c4;
        Curl_failf(data,"No authentication method was acceptable.");
        CVar15 = CURLPX_NO_AUTH;
      }
      goto LAB_00159945;
    }
    if (bVar2 != 0) {
      if (bVar2 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        CVar15 = CURLPX_GSSAPI_PERMSG;
      }
      else {
LAB_001590c4:
        Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
        CVar15 = CURLPX_UNKNOWN_MODE;
      }
      goto LAB_00159945;
    }
    cVar24 = sx->state;
LAB_0015933c:
    if (cVar24 != CONNECT_REQ_INIT) {
      sx->state = CONNECT_REQ_INIT;
    }
switchD_001586ca_caseD_9:
    if ((char)local_a0 == '\x05') {
      CVar12 = Curl_resolv(data,sx->hostname,sx->remote_port,(uint)cf->conn->ip_version,true,&dns);
      if (CVar12 == CURLE_OK) {
        if (sx->state != CONNECT_RESOLVED) {
          sx->state = CONNECT_RESOLVED;
        }
        if (dns == (Curl_dns_entry *)0x0) {
switchD_001586ca_caseD_b:
          pCVar20 = (Curl_addrinfo *)0x0;
        }
        else {
LAB_00158990:
          pCVar20 = dns->addr;
        }
        uVar18 = (data->set).ipver;
        if (uVar18 == '\0') {
          if (pCVar20 != (Curl_addrinfo *)0x0) {
LAB_0015954c:
            Curl_printable_address(pCVar20,dest,0x2e);
            sx->buffer[0] = '\x05';
            sx->buffer[1] = '\x01';
            sx->buffer[2] = '\0';
            if (pCVar20->ai_family == 10) {
              sx->buffer[3] = '\x04';
              psVar5 = pCVar20->ai_addr;
              lVar16 = 0;
              do {
                sx->buffer[lVar16 + 4] = psVar5->sa_data[lVar16 + 6];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 0x10);
              lVar16 = 0x14;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                uVar13 = sx->remote_port;
                pcVar22 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_0015966b:
                Curl_infof(data,pcVar22,dest,(ulong)uVar13);
              }
            }
            else if (pCVar20->ai_family == 2) {
              sx->buffer[3] = '\x01';
              psVar5 = pCVar20->ai_addr;
              lVar16 = 0;
              do {
                sx->buffer[lVar16 + 4] = psVar5->sa_data[lVar16 + 2];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 4);
              lVar16 = 8;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                uVar13 = sx->remote_port;
                pcVar22 = "SOCKS5 connect to %s:%d (locally resolved)";
                goto LAB_0015966b;
              }
            }
            else {
              Curl_failf(data,"SOCKS5 connection to %s not supported",dest);
              lVar16 = 3;
            }
            Curl_resolv_unlink(data,&dns);
            goto LAB_001596cb;
          }
        }
        else if (pCVar20 != (Curl_addrinfo *)0x0) {
          do {
            if (pCVar20->ai_family == (uint)(uVar18 != '\x01') * 8 + 2) goto LAB_0015954c;
            pCVar20 = pCVar20->ai_next;
          } while (pCVar20 != (Curl_addrinfo *)0x0);
        }
        Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
        goto LAB_0015960c;
      }
      CVar15 = CURLPX_RESOLVE_HOST;
      if (CVar12 == CURLE_AGAIN) {
        CVar15 = CURLPX_OK;
        if (sx->state != CONNECT_RESOLVING) {
          sx->state = CONNECT_RESOLVING;
          CVar15 = CURLPX_OK;
        }
      }
      goto LAB_00159945;
    }
    sx->buffer[0] = '\x05';
    sx->buffer[1] = '\x01';
    sx->buffer[2] = '\0';
LAB_0015935b:
    if (((pcVar3->bits).field_0x1 & 4) == 0) {
      iVar14 = inet_pton(2,sx->hostname,ip4);
      if (iVar14 == 1) {
        sx->buffer[3] = '\x01';
        *(uchar (*) [4])(sx->buffer + 4) = ip4;
        lVar16 = 8;
      }
      else {
        sx->buffer[3] = '\x03';
        sx->buffer[4] = (uchar)sVar17;
        memcpy(sx->buffer + 5,sx->hostname,sVar17);
        lVar16 = sVar17 + 5;
      }
    }
    else {
      iVar14 = inet_pton(10,sx->hostname,dest);
      if (iVar14 != 1) {
        CVar15 = CURLPX_BAD_ADDRESS_TYPE;
        goto LAB_00159945;
      }
      sx->buffer[3] = '\x04';
      *(undefined4 *)(sx->buffer + 4) = dest._0_4_;
      *(undefined4 *)(sx->buffer + 8) = dest._4_4_;
      *(undefined4 *)(sx->buffer + 0xc) = dest._8_4_;
      *(undefined4 *)(sx->buffer + 0x10) = dest._12_4_;
      lVar16 = 0x14;
    }
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level)))) {
      Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                 (ulong)(uint)sx->remote_port);
    }
LAB_001596cb:
    sx->buffer[lVar16] = *(uchar *)((long)&sx->remote_port + 1);
    sx->buffer[lVar16 + 1] = (uchar)sx->remote_port;
    sx->outp = puVar1;
    sx->outstanding = lVar16 + 2;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
switchD_001586ca_caseD_e:
    CVar15 = socks_state_send(cf->next,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
    if (CVar15 != CURLPX_OK) goto LAB_00159945;
    if (sx->outstanding == 0) {
      sx->outstanding = 10;
      sx->outp = puVar1;
      if (sx->state != CONNECT_REQ_READ) {
        sx->state = CONNECT_REQ_READ;
      }
switchD_001586ca_caseD_f:
      CVar15 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
      if (CVar15 == CURLPX_OK) {
        if (sx->outstanding != 0) goto LAB_001598d1;
        if (*puVar1 == '\x05') {
          bVar2 = sx->buffer[1];
          if (bVar2 == 0) {
            uVar18 = sx->buffer[3];
            if (uVar18 != '\x01') {
              if (uVar18 == '\x03') {
                if ((ulong)sx->buffer[4] < 4) goto LAB_001598da;
                lVar16 = (ulong)sx->buffer[4] + 7;
              }
              else {
                lVar16 = 0x16;
                if (uVar18 != '\x04') {
                  Curl_failf(data,"SOCKS5 reply has wrong address type.");
                  CVar15 = CURLPX_BAD_ADDRESS_TYPE;
                  goto LAB_00159945;
                }
              }
              sx->outstanding = lVar16 + -10;
              sx->outp = sx->buffer + 10;
              if (sx->state != CONNECT_REQ_READ_MORE) {
                sx->state = CONNECT_REQ_READ_MORE;
              }
switchD_001586ca_caseD_10:
              CVar15 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_ADDRESS,
                                        "SOCKS5 connect request address");
              if (CVar15 != CURLPX_OK) goto LAB_00159945;
              if (sx->outstanding != 0) goto LAB_001598d1;
            }
LAB_001598da:
            if (sx->state != CONNECT_DONE) {
              sx->state = CONNECT_DONE;
            }
            if (data != (Curl_easy *)0x0) goto switchD_001586ca_caseD_5;
LAB_0015993e:
            CVar15 = CURLPX_OK;
          }
          else {
            Curl_failf(data,"cannot complete SOCKS5 connection to %s. (%d)",sx->hostname,
                       (ulong)bVar2);
            CVar15 = CURLPX_REPLY_UNASSIGNED;
            if (bVar2 < 9) {
              CVar15 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar2 * 4);
            }
          }
        }
        else {
          Curl_failf(data,"SOCKS5 reply has wrong version, version should be 5.");
          CVar15 = CURLPX_BAD_VERSION;
        }
      }
      goto LAB_00159945;
    }
    goto LAB_001598d1;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar12 = CURLE_COULDNT_CONNECT;
    goto LAB_0015998c;
  }
  puVar1 = sx->buffer;
  dns = (Curl_dns_entry *)0x0;
  switch(cVar24) {
  case CONNECT_SOCKS_INIT:
    pcVar3->ip_version = '\x01';
    if ((data == (Curl_easy *)0x0) || (((ulong)pcVar3->bits & 1) == 0)) {
      if (data != (Curl_easy *)0x0) goto LAB_00158820;
    }
    else {
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        pcVar22 = "";
        if (bVar2 == 6) {
          pcVar22 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar22,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
LAB_00158820:
      if ((((data->set).field_0x89f & 0x40) != 0) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
    }
    iVar14 = sx->remote_port;
    uVar11 = (ushort)iVar14;
    sx->buffer[0] = '\x04';
    sx->buffer[1] = '\x01';
    *(ushort *)(sx->buffer + 2) = uVar11 << 8 | uVar11 >> 8;
    if (bVar2 != 6) {
      CVar12 = Curl_resolv(data,sx->hostname,iVar14,(uint)cf->conn->ip_version,true,&dns);
      if (CVar12 != CURLE_OK) {
        CVar15 = CURLPX_RESOLVE_HOST;
        if (CVar12 == CURLE_AGAIN) {
          if (sx->state != CONNECT_RESOLVING) {
            sx->state = CONNECT_RESOLVING;
          }
          CVar15 = CURLPX_OK;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
              (0 < pcVar6->log_level)))) {
            Curl_infof(data,"SOCKS4 non-blocking resolve of %s",sx->hostname);
            CVar15 = CURLPX_OK;
          }
        }
        break;
      }
      if (sx->state != CONNECT_RESOLVED) {
        sx->state = CONNECT_RESOLVED;
      }
      if (dns != (Curl_dns_entry *)0x0) goto LAB_001587c1;
      goto switchD_001585e3_caseD_b;
    }
    if (sx->state != CONNECT_REQ_INIT) {
      sx->state = CONNECT_REQ_INIT;
    }
  case CONNECT_REQ_INIT:
switchD_001585e3_caseD_9:
    sx->buffer[8] = '\0';
    pcVar22 = sx->proxy_user;
    if (pcVar22 != (char *)0x0) {
      sVar17 = strlen(pcVar22);
      if (0xff < sVar17) {
        Curl_failf(data,"Too long SOCKS proxy username");
        CVar15 = CURLPX_LONG_USER;
        break;
      }
      memcpy(sx->buffer + 8,pcVar22,sVar17 + 1);
    }
    sVar17 = strlen((char *)(sx->buffer + 8));
    uVar19 = sVar17 + 9;
    if (bVar2 == 6) {
      sx->buffer[4] = '\0';
      sx->buffer[5] = '\0';
      sx->buffer[6] = '\0';
      sx->buffer[7] = '\x01';
      local_a0 = sx->hostname;
      sVar17 = strlen(local_a0);
      if ((0xff < sVar17 + 1) || (uVar23 = sVar17 + 1 + uVar19, 599 < uVar23)) {
        Curl_failf(data,"SOCKS4: too long hostname");
        CVar15 = CURLPX_LONG_HOSTNAME;
        break;
      }
      strcpy((char *)(puVar1 + uVar19),local_a0);
      uVar19 = uVar23;
    }
    sx->outp = puVar1;
    sx->outstanding = uVar19;
    if (sx->state != CONNECT_REQ_SENDING) {
      sx->state = CONNECT_REQ_SENDING;
    }
switchD_001585e3_caseD_e:
    CVar15 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
    if (CVar15 == CURLPX_OK) {
      if (sx->outstanding == 0) {
        sx->outstanding = 8;
        sx->outp = puVar1;
        if (sx->state != CONNECT_SOCKS_READ) {
          sx->state = CONNECT_SOCKS_READ;
        }
switchD_001585e3_caseD_4:
        CVar15 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
        if (CVar15 == CURLPX_OK) {
          if (sx->outstanding != 0) goto LAB_001598d1;
          if (sx->state != CONNECT_DONE) {
            sx->state = CONNECT_DONE;
          }
switchD_001585e3_caseD_2:
          if (*puVar1 == '\0') {
            switch(sx->buffer[1]) {
            case 'Z':
              CVar15 = CURLPX_OK;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                pcVar22 = "";
                if (bVar2 == 6) {
                  pcVar22 = "a";
                }
                Curl_infof(data,"SOCKS4%s request granted.",pcVar22);
                CVar15 = CURLPX_OK;
              }
              break;
            case '[':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5b);
              CVar15 = CURLPX_REQUEST_FAILED;
              break;
            case '\\':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5c);
              CVar15 = CURLPX_IDENTD;
              break;
            case ']':
              Curl_failf(data,
                         "cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                         ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),0x5d);
              CVar15 = CURLPX_IDENTD_DIFFER;
              break;
            default:
              Curl_failf(data,"cannot complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                         (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                         (ulong)sx->buffer[7],
                         (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                        *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
              CVar15 = CURLPX_UNKNOWN_FAIL;
            }
          }
          else {
            Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
LAB_00158c1b:
            CVar15 = CURLPX_BAD_VERSION;
          }
        }
      }
      else {
LAB_001598d1:
        CVar15 = CURLPX_OK;
      }
    }
    break;
  default:
    goto switchD_001585e3_caseD_2;
  case CONNECT_SOCKS_READ:
    goto switchD_001585e3_caseD_4;
  case CONNECT_RESOLVING:
    CVar12 = Curl_resolv_check(data,&dns);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar15 = CURLPX_RESOLVE_HOST;
      if (CVar12 == CURLE_OK) {
        CVar15 = CURLPX_OK;
      }
      break;
    }
LAB_001587c1:
    for (pCVar20 = dns->addr; pCVar20 != (Curl_addrinfo *)0x0; pCVar20 = pCVar20->ai_next) {
      if (pCVar20->ai_family == 2) {
        Curl_printable_address(pCVar20,dest,0x40);
        psVar5 = pCVar20->ai_addr;
        sx->buffer[4] = psVar5->sa_data[2];
        sx->buffer[5] = psVar5->sa_data[3];
        sx->buffer[6] = psVar5->sa_data[4];
        sx->buffer[7] = psVar5->sa_data[5];
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",dest);
        }
        Curl_resolv_unlink(data,&dns);
        goto switchD_001585e3_caseD_9;
      }
    }
    Curl_failf(data,"SOCKS4 connection to %s not supported",sx->hostname);
LAB_0015960c:
    CVar15 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_RESOLVED:
switchD_001585e3_caseD_b:
    Curl_failf(data,"Failed to resolve \"%s\" for SOCKS4 connect.",sx->hostname);
    CVar15 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_REQ_SENDING:
    goto switchD_001585e3_caseD_e;
  }
LAB_00159945:
  if (CVar15 == CURLPX_OK) {
    CVar12 = CURLE_OK;
    if (sx->state == CONNECT_DONE) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_verboseconnect(data,conn,cf->sockindex);
      if (cf->ctx != (void *)0x0) {
        (*Curl_cfree)(cf->ctx);
        cf->ctx = (void *)0x0;
      }
    }
  }
  else {
    (data->info).pxcode = CVar15;
    CVar12 = CURLE_PROXY;
  }
LAB_0015998c:
  _Var10 = (_Bool)(cf->field_0x24 & 1);
LAB_0015852c:
  *done = _Var10;
  return CVar12;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}